

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

ParsedSchema __thiscall
capnp::SchemaParser::parseDiskFile
          (SchemaParser *this,StringPtr displayName,StringPtr diskPath,
          ArrayPtr<const_kj::StringPtr> importPath)

{
  MutexGuarded<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> *this_00;
  undefined8 *puVar1;
  Impl *pIVar2;
  PathPtr prefix;
  bool bVar3;
  int iVar4;
  DiskFileCompat *pDVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar6;
  Clock *clock;
  iterator iVar7;
  map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  *extraout_RDX;
  StringPtr *params;
  map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  *extraout_RDX_00;
  map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  *extraout_RDX_01;
  map<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
  *params_00;
  Maybe<kj::String> *displayNameOverride;
  void *__arg;
  _Base_ptr p_Var8;
  _Base_ptr *pp_Var9;
  ArrayPtr<const_char> *this_01;
  long lVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_bool>
  pVar11;
  ParsedSchema PVar12;
  ArrayPtr<const_kj::ReadableDirectory_*const> importPath_00;
  StringPtr pathRef;
  Path path;
  Fault f;
  StringPtr importDir;
  Path parsed;
  Array<const_kj::ReadableDirectory_*> result;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> lock;
  PathPtr cwd;
  pair<const_kj::StringPtr_*,_unsigned_long> importPathKey;
  Own<const_kj::ReadableDirectory> local_208;
  mapped_type *local_1f0;
  Path *local_1e8;
  _Base_ptr local_1e0;
  Own<kj::Directory> local_1d8;
  Array<kj::String> local_1c8;
  ImportDir local_1a8;
  pair<kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir> local_168;
  Maybe<kj::String> *local_110;
  Array<kj::String> local_108;
  ArrayBuilder<const_kj::ReadableDirectory_*> local_e8;
  SchemaParser *local_c8;
  Array<const_kj::ReadableDirectory_*> local_c0;
  Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_> local_a8;
  Array<kj::String> local_98;
  char *local_80;
  size_t local_78;
  PathPtr local_70;
  NullableValue<kj::String> local_60;
  key_type local_40;
  
  __arg = (void *)diskPath.content.size_;
  local_78 = displayName.content.size_;
  local_80 = displayName.content.ptr;
  pIVar2 = (this->impl).ptr;
  this_00 = &pIVar2->compat;
  local_c8 = this;
  kj::_::Mutex::lock(&this_00->mutex,EXCLUSIVE);
  local_a8.ptr = &(pIVar2->compat).value;
  local_a8.mutex = &this_00->mutex;
  if ((pIVar2->compat).value.ptr.isSet == false) {
    pDVar5 = kj::_::NullableValue<capnp::SchemaParser::DiskFileCompat>::emplace<>
                       (&(local_a8.ptr)->ptr);
  }
  else {
    pDVar5 = (DiskFileCompat *)&(pIVar2->compat).value.ptr.field_1;
  }
  iVar4 = (**pDVar5->fs->_vptr_Filesystem)();
  local_1e8 = (Path *)CONCAT44(extraout_var,iVar4);
  iVar4 = (*pDVar5->fs->_vptr_Filesystem[2])();
  local_70.parts.ptr = (String *)CONCAT44(extraout_var_00,iVar4);
  kj::PathPtr::eval((Path *)&local_1c8,&local_70,diskPath);
  if (importPath.size_ == 0) {
    params_00 = extraout_RDX;
    displayNameOverride = (Maybe<kj::String> *)0x0;
    pmVar6 = (mapped_type *)(ReadableDirectory **)0x0;
  }
  else {
    local_40.first = importPath.ptr;
    local_40.second = importPath.size_;
    pmVar6 = std::
             map<std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>,_std::less<std::pair<const_kj::StringPtr_*,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<const_kj::StringPtr_*,_unsigned_long>,_kj::Array<const_kj::ReadableDirectory_*>_>_>_>
             ::operator[](&pDVar5->cachedImportPaths,&local_40);
    local_110 = (Maybe<kj::String> *)pmVar6->size_;
    if (local_110 == (Maybe<kj::String> *)0x0) {
      local_1f0 = pmVar6;
      local_e8.pos = kj::_::HeapArrayDisposer::allocateUninitialized<kj::ReadableDirectory_const*>
                               (importPath.size_);
      local_e8.endPtr = local_e8.pos + importPath.size_;
      local_e8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
      local_1e0 = &(pDVar5->cachedImportDirs)._M_t._M_impl.super__Rb_tree_header._M_header;
      this_01 = &(importPath.ptr)->content;
      local_e8.ptr = local_e8.pos;
      while( true ) {
        if (this_01 == &importPath.ptr[importPath.size_].content) break;
        iVar7 = std::
                _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
                ::find(&(pDVar5->cachedImportDirs)._M_t,(key_type *)this_01);
        if (iVar7._M_node == local_1e0) {
          kj::PathPtr::eval((Path *)&local_108,&local_70,(StringPtr)*this_01);
          local_208.disposer = (Disposer *)0x0;
          local_208.ptr = (ReadableDirectory *)0x0;
          (*(code *)(local_1e8->parts).ptr[3].content.disposer)
                    (&local_1a8,local_1e8,local_108.ptr,local_108.size_);
          local_168.first.content.ptr = local_1a8.pathStr.content.ptr;
          local_168.first.content.size_ = local_1a8.pathStr.content.size_;
          local_1a8.pathStr.content.size_ = 0;
          kj::Own<const_kj::ReadableDirectory>::dispose
                    ((Own<const_kj::ReadableDirectory> *)&local_1a8);
          if (local_168.first.content.size_ == 0) {
            clock = kj::nullClock();
            kj::newInMemoryDirectory((kj *)&local_1d8,clock);
            local_1a8.pathStr.content.ptr = (char *)local_1d8.disposer;
            local_1a8.pathStr.content.size_ = (size_t)local_1d8.ptr;
            local_1d8.ptr = (Directory *)0x0;
            kj::Own<const_kj::ReadableDirectory>::operator=
                      (&local_208,(Own<const_kj::ReadableDirectory> *)&local_1a8);
            kj::Own<const_kj::ReadableDirectory>::dispose
                      ((Own<const_kj::ReadableDirectory> *)&local_1a8);
            kj::Own<kj::Directory>::dispose(&local_1d8);
          }
          else {
            kj::Own<const_kj::ReadableDirectory>::operator=
                      (&local_208,(Own<const_kj::ReadableDirectory> *)&local_168);
          }
          kj::Own<const_kj::ReadableDirectory>::dispose
                    ((Own<const_kj::ReadableDirectory> *)&local_168);
          p_Var8 = (_Base_ptr)local_208.ptr;
          local_1d8.disposer = (Disposer *)this_01->ptr;
          local_1d8.ptr = (Directory *)this_01->size_;
          kj::str<kj::StringPtr_const&>(&local_1a8.pathStr,(kj *)this_01,params);
          local_168.second.path.parts.size_ = local_108.size_;
          local_168.second.path.parts.ptr = local_108.ptr;
          local_168.second.dir.ptr = local_208.ptr;
          local_1a8.path.parts.disposer = local_108.disposer;
          local_108.ptr = (String *)0x0;
          local_108.size_ = 0;
          local_208.ptr = (ReadableDirectory *)0x0;
          local_1a8.dir.disposer = local_208.disposer;
          local_168.first.content.ptr = (char *)local_1d8.disposer;
          local_168.first.content.size_ = (size_t)local_1d8.ptr;
          local_168.second.pathStr.content.ptr = local_1a8.pathStr.content.ptr;
          local_168.second.pathStr.content.size_ = local_1a8.pathStr.content.size_;
          local_168.second.pathStr.content.disposer = local_1a8.pathStr.content.disposer;
          local_1a8.pathStr.content.ptr = (char *)0x0;
          local_1a8.pathStr.content.size_ = 0;
          local_168.second.path.parts.disposer = local_108.disposer;
          local_1a8.path.parts.ptr = (String *)0x0;
          local_1a8.path.parts.size_ = 0;
          local_168.second.dir.disposer = local_208.disposer;
          local_1a8.dir.ptr = (ReadableDirectory *)0x0;
          pVar11 = std::
                   _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                   ::
                   _M_emplace_unique<std::pair<kj::StringPtr,capnp::SchemaParser::DiskFileCompat::ImportDir>>
                             ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>,std::_Select1st<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::SchemaParser::DiskFileCompat::ImportDir>>>
                               *)&pDVar5->cachedImportDirs,&local_168);
          DiskFileCompat::ImportDir::~ImportDir(&local_168.second);
          DiskFileCompat::ImportDir::~ImportDir(&local_1a8);
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            kj::_::Debug::Fault::Fault
                      ((Fault *)&local_168,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
                       ,0xf6,FAILED,
                       "compat->cachedImportDirs.insert(std::make_pair(pathRef, DiskFileCompat::ImportDir { kj::str(path), kj::mv(parsed), kj::mv(dir) })).second"
                       ,"");
            kj::_::Debug::Fault::fatal((Fault *)&local_168);
          }
          kj::Own<const_kj::ReadableDirectory>::dispose(&local_208);
          kj::Array<kj::String>::~Array(&local_108);
        }
        else {
          p_Var8 = iVar7._M_node[3]._M_parent;
        }
        *local_e8.pos = (RemoveConst<const_kj::ReadableDirectory_*>)p_Var8;
        local_e8.pos = local_e8.pos + 1;
        this_01 = this_01 + 1;
      }
      local_c0.size_ = (long)local_e8.pos - (long)local_e8.ptr >> 3;
      local_c0.ptr = local_e8.ptr;
      local_c0.disposer = local_e8.disposer;
      local_e8.ptr = (ReadableDirectory **)0x0;
      local_e8.pos = (RemoveConst<const_kj::ReadableDirectory_*> *)0x0;
      local_e8.endPtr = (ReadableDirectory **)0x0;
      kj::ArrayBuilder<const_kj::ReadableDirectory_*>::dispose(&local_e8);
      pmVar6 = local_1f0;
      kj::Array<const_kj::ReadableDirectory_*>::operator=(local_1f0,&local_c0);
      kj::Array<const_kj::ReadableDirectory_*>::~Array(&local_c0);
      local_110 = (Maybe<kj::String> *)pmVar6->size_;
    }
    local_1f0 = (mapped_type *)pmVar6->ptr;
    params_00 = &pDVar5->cachedImportDirs;
    pp_Var9 = (_Base_ptr *)0x0;
    p_Var8 = (_Base_ptr)0x0;
    local_1e0 = (_Base_ptr)params_00;
    for (lVar10 = 0; importPath.size_ * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
      puVar1 = (undefined8 *)((long)&((importPath.ptr)->content).ptr + lVar10);
      local_168.first.content.ptr = (char *)*puVar1;
      local_168.first.content.size_ = puVar1[1];
      iVar7 = std::
              _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::SchemaParser::DiskFileCompat::ImportDir>_>_>
              ::find(local_1e0,&local_168.first);
      if ((_Rb_tree_header *)iVar7._M_node ==
          &(pDVar5->cachedImportDirs)._M_t._M_impl.super__Rb_tree_header) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-parser.c++"
                   ,0x104,FAILED,"iter != compat->cachedImportDirs.end()","");
        kj::_::Debug::Fault::fatal((Fault *)&local_1a8);
      }
      prefix.parts.ptr = (String *)iVar7._M_node[2]._M_parent;
      prefix.parts.size_ = (size_t)iVar7._M_node[2]._M_left;
      bVar3 = kj::Path::startsWith((Path *)&local_1c8,prefix);
      if (bVar3) {
        if (p_Var8 < iVar7._M_node[2]._M_left) {
          pp_Var9 = &iVar7._M_node[1]._M_left;
          p_Var8 = iVar7._M_node[2]._M_left;
        }
      }
      params_00 = extraout_RDX_00;
    }
    displayNameOverride = local_110;
    pmVar6 = local_1f0;
    if (pp_Var9 != (_Base_ptr *)0x0) {
      local_1e8 = (Path *)pp_Var9[7];
      local_1a8.pathStr.content.ptr = (char *)(local_1c8.ptr + (long)pp_Var9[4]);
      local_1a8.pathStr.content.size_ = local_1c8.size_ - (long)pp_Var9[4];
      kj::PathPtr::clone((PathPtr *)&local_168,(__fn *)&local_1a8,local_1a8.pathStr.content.ptr,
                         (int)local_1a8.pathStr.content.size_,__arg);
      kj::Array<kj::String>::operator=(&local_1c8,(Array<kj::String> *)&local_168);
      kj::Array<kj::String>::~Array((Array<kj::String> *)&local_168);
      params_00 = extraout_RDX_01;
      displayNameOverride = local_110;
      pmVar6 = local_1f0;
    }
  }
  local_98.ptr = local_1c8.ptr;
  local_98.size_ = local_1c8.size_;
  local_98.disposer = local_1c8.disposer;
  local_1c8.ptr = (String *)0x0;
  local_1c8.size_ = 0;
  kj::str<kj::StringPtr&>((String *)&local_168,(kj *)&local_80,(StringPtr *)params_00);
  local_60.isSet = true;
  local_60.field_1.value.content.ptr = local_168.first.content.ptr;
  local_60.field_1.value.content.size_ = local_168.first.content.size_;
  local_60.field_1.value.content.disposer = (ArrayDisposer *)local_168.second.pathStr.content.ptr;
  local_168.first.content.ptr = (char *)0x0;
  local_168.first.content.size_ = 0;
  importPath_00.size_ = (size_t)pmVar6;
  importPath_00.ptr = (ReadableDirectory **)&local_98;
  SchemaFile::newFromDirectory
            ((ReadableDirectory *)&local_1a8,local_1e8,importPath_00,displayNameOverride);
  PVar12 = parseFile(local_c8,(Own<capnp::SchemaFile> *)&local_1a8);
  kj::Own<capnp::SchemaFile>::dispose((Own<capnp::SchemaFile> *)&local_1a8);
  kj::_::NullableValue<kj::String>::~NullableValue(&local_60);
  kj::Array<char>::~Array((Array<char> *)&local_168);
  kj::Array<kj::String>::~Array(&local_98);
  kj::Array<kj::String>::~Array(&local_1c8);
  kj::Locked<kj::Maybe<capnp::SchemaParser::DiskFileCompat>_>::~Locked(&local_a8);
  return PVar12;
}

Assistant:

ParsedSchema SchemaParser::parseDiskFile(
    kj::StringPtr displayName, kj::StringPtr diskPath,
    kj::ArrayPtr<const kj::StringPtr> importPath) const {
  auto lock = impl->compat.lockExclusive();
  DiskFileCompat* compat;
  KJ_IF_MAYBE(c, *lock) {
    compat = c;
  } else {
    compat = &lock->emplace();
  }